

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_8ca613::HandleFilesMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  MessageType t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmExecutionStatus *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  PolicyStatus PVar4;
  const_reference pvVar5;
  reference args_00;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  char *modeName;
  cmGlobalGenerator *pcVar10;
  reference filename;
  ostream *poVar11;
  PolicyID id;
  string_view name;
  unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> local_7a0;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_798;
  cmAlphaNum local_790;
  cmAlphaNum local_760;
  string local_730;
  undefined1 local_710 [8];
  string destination;
  cmAlphaNum local_6c0;
  string local_690;
  string local_670;
  string local_650;
  MessageType local_62c;
  undefined1 local_628 [4];
  MessageType messageType;
  ostringstream e;
  char *local_4b0;
  char *modal;
  string *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGlobalGenerator *gg;
  undefined1 local_478 [4];
  PolicyStatus policyStatus;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  cmAlphaNum local_430;
  string local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesVector;
  cmAlphaNum local_3a8;
  string local_378;
  undefined1 local_358 [8];
  string type;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  ParseResult local_2b0;
  undefined1 local_280 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_258 [8];
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  files;
  string local_230;
  undefined1 local_210 [8];
  cmInstallCommandArguments ica;
  undefined1 local_50 [7];
  bool programs;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)local_50,status);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  ica.DefaultComponentName.field_2._M_local_buf[0xf] = std::operator==(pvVar5,"PROGRAMS");
  std::__cxx11::string::string((string *)&local_230,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_258);
  if ((ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) == 0) {
    name = (string_view)::cm::operator____s("FILES",5);
  }
  else {
    name = (string_view)::cm::operator____s("PROGRAMS",8);
  }
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)name._M_len;
  cmArgumentParser<void>::
  Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((cmArgumentParser<void> *)local_210,(static_string_view)name,
             (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_280);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_2b0,(cmArgumentParser<void> *)local_210,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_280,0);
  ArgumentParser::ParseResult::~ParseResult(&local_2b0);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_280);
  uVar2 = helper.DefaultComponentName.field_2._8_8_;
  if (!bVar3) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_300,pvVar5);
    cmAlphaNum::cmAlphaNum(&local_330," given unknown argument \"");
    args_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_280,0);
    cmStrCat<std::__cxx11::string,char[3]>
              (&local_2d0,&local_300,&local_330,args_00,(char (*) [3])0xc51f8d);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    args_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
    goto LAB_0052bd77;
  }
  psVar6 = cmInstallCommandArguments::GetType_abi_cxx11_((cmInstallCommandArguments *)local_210);
  std::__cxx11::string::string((string *)local_358,(string *)psVar6);
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) == 0) &&
     (sVar8 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(anonymous_namespace)::allowedTypes_abi_cxx11_,(key_type *)local_358),
     uVar2 = helper.DefaultComponentName.field_2._8_8_, sVar8 == 0)) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_3a8,pvVar5);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&filesVector," given non-type \"");
    cmStrCat<std::__cxx11::string,char[22]>
              (&local_378,&local_3a8,(cmAlphaNum *)&filesVector,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
               (char (*) [22])"\" with TYPE argument.");
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    args_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
  }
  else {
    local_3e0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258;
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_3e0);
    if (bVar3) {
      args_local._7_1_ = 1;
      type.field_2._12_4_ = 1;
    }
    else {
      cmInstallCommandArguments::GetRename_abi_cxx11_((cmInstallCommandArguments *)local_210);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_3e0), uVar2 = helper.DefaultComponentName.field_2._8_8_, 1 < sVar9))
      {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmAlphaNum::cmAlphaNum(&local_430,pvVar5);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   " given RENAME option with more than one file.");
        cmStrCat<>(&local_400,&local_430,
                   (cmAlphaNum *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        args_local._7_1_ = 0;
        type.field_2._12_4_ = 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_478);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,0);
        modeName = (char *)std::__cxx11::string::c_str();
        bVar3 = Helper::MakeFilesFullPath
                          ((Helper *)local_50,modeName,local_3e0,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_478);
        if (bVar3) {
          PVar4 = cmMakefile::GetPolicyStatus((cmMakefile *)helper.Status,CMP0062,false);
          pcVar10 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          this = local_3e0;
          __end1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(local_3e0);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&file), bVar3) {
            filename = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end1);
            bVar3 = cmGlobalGenerator::IsExportedTargetsFile(pcVar10,filename);
            if (bVar3) {
              local_4b0 = (char *)0x0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
              local_62c = AUTHOR_WARNING;
              if (PVar4 != OLD) {
                if (PVar4 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_650,(cmPolicies *)0x3e,id);
                  poVar11 = std::operator<<((ostream *)local_628,(string *)&local_650);
                  std::operator<<(poVar11,"\n");
                  std::__cxx11::string::~string((string *)&local_650);
                  local_4b0 = "should";
                }
                else if (PVar4 - NEW < 3) {
                  local_4b0 = "may";
                  local_62c = FATAL_ERROR;
                }
              }
              if (local_4b0 == (char *)0x0) {
LAB_0052b9c3:
                type.field_2._12_4_ = 0;
              }
              else {
                poVar11 = std::operator<<((ostream *)local_628,"The file\n  ");
                poVar11 = std::operator<<(poVar11,(string *)filename);
                poVar11 = std::operator<<(poVar11,"\nwas generated by the export() command.  It ");
                poVar11 = std::operator<<(poVar11,local_4b0);
                std::operator<<(poVar11,
                                " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                               );
                pcVar1 = helper.Status;
                t = local_62c;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage((cmMakefile *)pcVar1,t,&local_670);
                std::__cxx11::string::~string((string *)&local_670);
                if (local_62c != FATAL_ERROR) goto LAB_0052b9c3;
                args_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
              if (type.field_2._12_4_ != 0) goto LAB_0052bd3f;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1);
          }
          bVar3 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_210);
          if (bVar3) {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              cmInstallCommandArguments::GetDestination_abi_cxx11_
                        ((cmInstallCommandArguments *)local_210);
              uVar7 = std::__cxx11::string::empty();
              uVar2 = helper.DefaultComponentName.field_2._8_8_;
              if ((uVar7 & 1) == 0) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,0);
                cmAlphaNum::cmAlphaNum(&local_6c0,pvVar5);
                cmAlphaNum::cmAlphaNum
                          ((cmAlphaNum *)((long)&destination.field_2 + 8),
                           " given both TYPE and DESTINATION arguments. You may only specify one.");
                cmStrCat<>(&local_690,&local_6c0,(cmAlphaNum *)((long)&destination.field_2 + 8));
                cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_690);
                std::__cxx11::string::~string((string *)&local_690);
                args_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
                goto LAB_0052bd3f;
              }
            }
            Helper::GetDestinationForType
                      ((string *)local_710,(Helper *)local_50,(cmInstallCommandArguments *)local_210
                       ,(string *)local_358);
            uVar7 = std::__cxx11::string::empty();
            uVar2 = helper.DefaultComponentName.field_2._8_8_;
            pcVar1 = helper.Status;
            bVar3 = (uVar7 & 1) != 0;
            if (bVar3) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              cmAlphaNum::cmAlphaNum(&local_760,pvVar5);
              cmAlphaNum::cmAlphaNum(&local_790," given no DESTINATION!");
              cmStrCat<>(&local_730,&local_760,&local_790);
              cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_730);
              std::__cxx11::string::~string((string *)&local_730);
            }
            else {
              CreateInstallFilesGenerator
                        ((anon_unknown_dwarf_8ca613 *)&local_7a0,(cmMakefile *)helper.Status,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_478,(cmInstallCommandArguments *)local_210,
                         (bool)(ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1),
                         (string *)local_710);
              std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
              unique_ptr<cmInstallFilesGenerator,std::default_delete<cmInstallFilesGenerator>,void>
                        ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                         &local_798,&local_7a0);
              cmMakefile::AddInstallGenerator((cmMakefile *)pcVar1,&local_798);
              std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
              ~unique_ptr(&local_798);
              std::
              unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_>::
              ~unique_ptr(&local_7a0);
              pcVar10 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
              psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                                 ((cmInstallCommandArguments *)local_210);
              cmGlobalGenerator::AddInstallComponent(pcVar10,psVar6);
            }
            args_local._7_1_ = !bVar3;
            type.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)local_710);
          }
          else {
            args_local._7_1_ = 0;
            type.field_2._12_4_ = 1;
          }
        }
        else {
          args_local._7_1_ = 0;
          type.field_2._12_4_ = 1;
        }
LAB_0052bd3f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_478);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_358);
LAB_0052bd77:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_280);
  ArgumentParser::
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~MaybeEmpty((MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_258);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_210);
  Helper::~Helper((Helper *)local_50);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleFilesMode(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  Helper helper(status);

  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(helper.DefaultComponentName);
  ArgumentParser::MaybeEmpty<std::vector<std::string>> files;
  ica.Bind(programs ? "PROGRAMS"_s : "FILES"_s, files);
  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    status.SetError(
      cmStrCat(args[0], " given non-type \"", type, "\" with TYPE argument."));
    return false;
  }

  const std::vector<std::string>& filesVector = files;

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    status.SetError(
      cmStrCat(args[0], " given RENAME option with more than one file."));
    return false;
  }

  std::vector<std::string> absFiles;
  if (!helper.MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus policyStatus =
    helper.Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = helper.Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (policyStatus) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
          break;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        helper.Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION arguments. "
                             "You may only specify one."));
    return false;
  }

  std::string destination = helper.GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Create the files install generator.
  helper.Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    helper.Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}